

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O2

opt_object opt_init(int N)

{
  opt_object poVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  poVar1 = (opt_object)malloc((long)N * 8 + 0x88);
  uVar3 = 0;
  dVar4 = macheps();
  poVar1->eps = dVar4;
  poVar1->xtol = dVar4;
  dVar4 = pow(dVar4,0.3333333333333333);
  poVar1->gtol = dVar4;
  poVar1->ftol = dVar4 * dVar4;
  poVar1->stol = dVar4 * dVar4;
  poVar1->N = N;
  poVar1->MaxIter = N * 200;
  poVar1->retval = 0;
  if (N < 5) {
    poVar1->MaxIter = 1000;
  }
  poVar1->Iter = 0;
  poVar1->Method = 0;
  poVar1->maxstep = -1.0;
  builtin_strncpy(poVar1->MethodName,"Nelder-Mead",0xc);
  poVar1->objfunc = 0.0;
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    poVar1->xopt[uVar3] = 0.0;
  }
  return poVar1;
}

Assistant:

opt_object opt_init(int N) {
	opt_object obj = NULL;
	int i;
	double meps;

	obj = (opt_object) malloc (sizeof(struct opt_set) + sizeof(double)* (N-1));

	meps = macheps();
	obj->eps = meps;
	obj->xtol = meps;
	obj->gtol = pow(meps,(double)1.0/3.0);
	obj->ftol = obj->gtol * obj->gtol;
	obj->stol = obj->ftol;
	obj->N = N;
	obj->MaxIter = 200*N;
	obj->retval = 0;

	if (obj->MaxIter < 1000) {
		obj->MaxIter = 1000;
	}

	obj->Iter = 0;
	obj->Method = 0;
	obj->maxstep = -1.0;
	strcpy(obj->MethodName,"Nelder-Mead");
	obj->objfunc = 0.0;
	for (i = 0; i < N;++i) {
		obj->xopt[i] = 0.0;
	}

	return obj;
}